

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  undefined8 uVar3;
  x86_reg r2;
  uint8_t uVar4;
  byte bVar5;
  unsigned_short uVar6;
  uint uVar7;
  cs_detail *pcVar8;
  x86_reg r1;
  
  uVar6 = insn_find(insns,0x1726,id,&h->insn_cache);
  if (uVar6 == 0) {
    return;
  }
  insn->id = (uint)insns[uVar6].mapid;
  if (h->detail == CS_OPT_OFF) {
    return;
  }
  pcVar8 = insn->detail;
  *(undefined4 *)(pcVar8->regs_read + 8) = *(undefined4 *)(insns[uVar6].regs_use + 8);
  *(undefined8 *)pcVar8->regs_read = *(undefined8 *)insns[uVar6].regs_use;
  uVar7 = count_positive(insns[uVar6].regs_use);
  pcVar8 = insn->detail;
  pcVar8->regs_read_count = (uint8_t)uVar7;
  if (id == 0x935) {
    if (h->mode == CS_MODE_64) {
LAB_001a3325:
      *(undefined4 *)(pcVar8->regs_write + 0x10) = *(undefined4 *)(insns[uVar6].regs_mod + 0x10);
      uVar3 = *(undefined8 *)(insns[uVar6].regs_mod + 8);
      *(undefined8 *)pcVar8->regs_write = *(undefined8 *)insns[uVar6].regs_mod;
      *(undefined8 *)(pcVar8->regs_write + 8) = uVar3;
      goto LAB_001a334e;
    }
    pcVar8->regs_write[0] = '\x13';
    insn->detail->regs_write[1] = '\x18';
    uVar4 = '\x02';
  }
  else if (id == 0x936) {
    if (h->mode == CS_MODE_64) goto LAB_001a3325;
    pcVar8->regs_write[0] = '\x13';
    insn->detail->regs_write[1] = '\x16';
    insn->detail->regs_write[2] = '\x18';
    uVar4 = '\x03';
  }
  else {
    *(undefined4 *)(pcVar8->regs_write + 0x10) = *(undefined4 *)(insns[uVar6].regs_mod + 0x10);
    uVar3 = *(undefined8 *)(insns[uVar6].regs_mod + 8);
    *(undefined8 *)pcVar8->regs_write = *(undefined8 *)insns[uVar6].regs_mod;
    *(undefined8 *)(pcVar8->regs_write + 8) = uVar3;
LAB_001a334e:
    uVar7 = count_positive(insns[uVar6].regs_mod);
    uVar4 = (uint8_t)uVar7;
  }
  pcVar8 = insn->detail;
  pcVar8->regs_write_count = uVar4;
  uVar7 = insn->id;
  if ((uVar7 - 0x266 < 0x39) && ((0x1e000000000000dU >> ((ulong)(uVar7 - 0x266) & 0x3f) & 1) != 0))
  {
    if (h->mode == CS_MODE_64) {
      uVar4 = pcVar8->regs_read_count;
      r1 = X86_REG_EDI;
      r2 = X86_REG_RDI;
    }
    else {
      if (h->mode != CS_MODE_16) goto LAB_001a34f2;
      uVar4 = pcVar8->regs_read_count;
      r1 = X86_REG_EDI;
      r2 = X86_REG_DI;
    }
  }
  else {
    if ((4 < uVar7 - 0x60) || (uVar7 - 0x60 == 3)) {
      if (uVar7 - 0x148 < 4) {
        if (h->mode == CS_MODE_64) goto LAB_001a34b9;
        if (h->mode != CS_MODE_16) goto LAB_001a34f2;
        goto LAB_001a3464;
      }
      if ((uVar7 - 0x1cf < 7) && ((0x53U >> (uVar7 - 0x1cf & 0x1f) & 1) != 0)) goto LAB_001a3409;
      if (2 < uVar7 - 0x14c) goto LAB_001a34f2;
      cVar2 = h->mode;
      if (cVar2 == CS_MODE_16) {
        uVar4 = '\f';
LAB_001a357a:
        pcVar8->regs_read[0] = uVar4;
        pcVar8 = insn->detail;
        pcVar8->regs_read_count = '\x01';
        pcVar8->regs_write[0] = uVar4;
        pcVar8 = insn->detail;
        pcVar8->regs_write_count = '\x01';
      }
      else {
        if (cVar2 == CS_MODE_64) {
          uVar4 = '&';
          goto LAB_001a357a;
        }
        if (cVar2 == CS_MODE_32) {
          uVar4 = '\x16';
          goto LAB_001a357a;
        }
      }
      if (insn->id != 0x14c) {
        pcVar8->regs_read[1] = '\x19';
        insn->detail->regs_read_count = '\x02';
      }
      goto LAB_001a34f2;
    }
LAB_001a3409:
    if (h->mode == CS_MODE_64) {
      arr_replace(pcVar8->regs_read,pcVar8->regs_read_count,X86_REG_EDI,X86_REG_RDI);
      arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,X86_REG_RDI);
      pcVar8 = insn->detail;
LAB_001a34b9:
      uVar4 = pcVar8->regs_read_count;
      r1 = X86_REG_ESI;
      r2 = X86_REG_RSI;
    }
    else {
      if (h->mode != CS_MODE_16) goto LAB_001a34f2;
      arr_replace(pcVar8->regs_read,pcVar8->regs_read_count,X86_REG_EDI,X86_REG_DI);
      arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,X86_REG_EDI,X86_REG_DI);
      pcVar8 = insn->detail;
LAB_001a3464:
      uVar4 = pcVar8->regs_read_count;
      r1 = X86_REG_ESI;
      r2 = X86_REG_SI;
    }
  }
  arr_replace(pcVar8->regs_read,uVar4,r1,r2);
  arr_replace(insn->detail->regs_write,insn->detail->regs_write_count,r1,r2);
LAB_001a34f2:
  *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[uVar6].groups;
  uVar7 = count_positive(insns[uVar6].groups);
  bVar5 = (byte)uVar7;
  pcVar8 = insn->detail;
  pcVar8->groups_count = bVar5;
  if ((insns[uVar6].branch != false) || (insns[uVar6].indirect_branch == true)) {
    pcVar8->groups[uVar7 & 0xff] = '\x01';
    pcVar8 = insn->detail;
    bVar5 = pcVar8->groups_count + 1;
    pcVar8->groups_count = bVar5;
  }
  uVar7 = insns[uVar6].id - 0x766;
  if (((uVar7 < 5) && ((0x15U >> (uVar7 & 0x1f) & 1) != 0)) &&
     (*(long *)((long)&pcVar8->field_6 + 0x38) == -0x4e)) {
    pcVar8->groups[bVar5] = '\x04';
    puVar1 = &insn->detail->groups_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			switch(insn->id) {
				default:
					break;

				case X86_INS_LOOP:
				case X86_INS_LOOPE:
				case X86_INS_LOOPNE:
					switch(h->mode) {
						default: break;
						case CS_MODE_16:
								 insn->detail->regs_read[0] = X86_REG_CX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_CX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_32:
								 insn->detail->regs_read[0] = X86_REG_ECX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_ECX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_64:
								 insn->detail->regs_read[0] = X86_REG_RCX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_RCX;
								 insn->detail->regs_write_count = 1;
								 break;
					}

					// LOOPE & LOOPNE also read EFLAGS
					if (insn->id != X86_INS_LOOP) {
						insn->detail->regs_read[1] = X86_REG_EFLAGS;
						insn->detail->regs_read_count = 2;
					}

					break;

				case X86_INS_LODSB:
				case X86_INS_LODSD:
				case X86_INS_LODSQ:
				case X86_INS_LODSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_SCASB:
				case X86_INS_SCASW:
				case X86_INS_SCASQ:
				case X86_INS_STOSB:
				case X86_INS_STOSD:
				case X86_INS_STOSQ:
				case X86_INS_STOSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							break;
					}
					break;

				case X86_INS_CMPSB:
				case X86_INS_CMPSD:
				case X86_INS_CMPSQ:
				case X86_INS_CMPSW:
				case X86_INS_MOVSB:
				case X86_INS_MOVSW:
				case X86_INS_MOVSD:
				case X86_INS_MOVSQ:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}